

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::WriteVarBounds
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *this)

{
  NLHeader *pNVar1;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *in_RDI;
  VarBndWriter vbw;
  VarBndWriter *in_stack_00000028;
  NLFeeder_Easy *in_stack_00000030;
  VarBndWriter local_18;
  
  pNVar1 = Hdr(in_RDI);
  BinaryFormatter::apr
            (&in_RDI->super_FormatterType,&in_RDI->nm,"b\t#%d bounds (on variables)\n",
             (ulong)(uint)(pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars);
  VarBndWriter::VarBndWriter(&local_18,in_RDI);
  Feeder(in_RDI);
  NLFeeder_Easy::
  FeedVarBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::VarBndWriter>
            (in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void NLWriter2<Params>::WriteVarBounds() {
	apr(nm, "b\t#%d bounds (on variables)\n",
      (int)Hdr().num_vars);
  VarBndWriter vbw(*this);
  Feeder().FeedVarBounds(vbw);
  assert((int)Hdr().num_vars == vbw.GetNWritten());
}